

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool string_count(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_value_t value;
  gravity_value_t value_00;
  gravity_fiber_t *fiber;
  uint local_1054;
  int local_1050;
  int i;
  int count;
  int j;
  gravity_string_t *str_to_count;
  gravity_string_t *main_str;
  char local_1028 [8];
  char _buffer [4096];
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  _buffer._4088_4_ = rindex;
  _buffer._4094_2_ = nargs;
  if ((nargs == 2) && (args[1].isa == gravity_class_string)) {
    i = 0;
    local_1050 = 0;
    for (local_1054 = 0; local_1054 < *(uint *)((long)&((args->field_1).p)->identifier + 4);
        local_1054 = local_1054 + 1) {
      if (*(char *)((long)&((args->field_1).p)->objclass->isa + (long)(int)local_1054) ==
          *(char *)((long)&(args[1].field_1.p)->objclass->isa + (long)i)) {
        if (i == *(int *)((long)&(args[1].field_1.p)->identifier + 4) + -1) {
          local_1050 = local_1050 + 1;
          i = 0;
        }
        else {
          i = i + 1;
        }
      }
      else {
        i = 0;
      }
    }
    value.field_1 =
         (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
         (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(long)local_1050;
    value.isa = gravity_class_int;
    gravity_vm_setslot(vm,value,rindex);
    vm_local._7_1_ = true;
  }
  else {
    snprintf(local_1028,0x1000,"String.count() expects a string as an argument");
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1028);
    value_00.field_1.n = 0;
    value_00.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_00,_buffer._4088_4_);
    vm_local._7_1_ = false;
  }
  return vm_local._7_1_;
}

Assistant:

static bool string_count (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm)

    if ((nargs != 2) || (!VALUE_ISA_STRING(GET_VALUE(1)))) {
        RETURN_ERROR("String.count() expects a string as an argument");
    }

    gravity_string_t *main_str = VALUE_AS_STRING(GET_VALUE(0));
    gravity_string_t *str_to_count = VALUE_AS_STRING(GET_VALUE(1));

    int j = 0;
    int count = 0;

    // iterate through whole string
    for (int i = 0; i < main_str->len; ++i) {
        if (main_str->s[i] == str_to_count->s[j]) {
            // if the characters match and we are on the last character of the search
            // string, then we have found a match
            if (j == str_to_count->len - 1) {
                ++count;
                j = 0;
                continue;
            }
        }
        // reset if it isn't a match
        else {
            j = 0;
            continue;
        }
        // move forward in the search string if we found a match but we aren't
        // finished checking all the characters of the search string yet
        ++j;
    }

    RETURN_VALUE(VALUE_FROM_INT(count), rindex);
}